

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *pRVar9;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  
  lVar8 = (long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.name_;
  pRVar9 = this_00;
  if ((undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x1) !=
      (undefined1  [80])0x0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)pRVar4->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)pRVar4->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar9 != (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar9 = (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
               &(pRVar9->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = UninterpretedOption_NamePart::ByteSizeLong
                      ((UninterpretedOption_NamePart *)
                       (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar8 = lVar8 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = *(uint *)&this->field_0;
  sVar5 = (ulong)((uVar3 & 0x20) >> 5) * 9 + lVar8;
  if ((uVar3 & 0x1f) != 0) {
    if ((uVar3 & 1) != 0) {
      lVar8 = *(long *)(((ulong)(this->field_0)._impl_.identifier_value_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar8 | 1;
      iVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      lVar8 = *(long *)(((ulong)(this->field_0)._impl_.string_value_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar8 | 1;
      iVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 4) != 0) {
      lVar8 = *(long *)(((ulong)(this->field_0)._impl_.aggregate_value_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar8 | 1;
      iVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      uVar7 = (this->field_0)._impl_.positive_int_value_ | 1;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar8 * 9 + 0x89U >> 6);
    }
    if ((uVar3 & 0x10) != 0) {
      uVar7 = (this->field_0)._impl_.negative_int_value_ | 1;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar8 * 9 + 0x89U >> 6);
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t UninterpretedOption::ByteSizeLong() const {
  const UninterpretedOption& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
    {
      total_size += 1UL * this_._internal_name_size();
      for (const auto& msg : this_._internal_name()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000020u & cached_has_bits) * 9;
  if ((cached_has_bits & 0x0000001fu) != 0) {
    // optional string identifier_value = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_identifier_value());
    }
    // optional bytes string_value = 7;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_string_value());
    }
    // optional string aggregate_value = 8;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_aggregate_value());
    }
    // optional uint64 positive_int_value = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_positive_int_value());
    }
    // optional int64 negative_int_value = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_negative_int_value());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}